

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O3

Region * __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::detect(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
         *this,uint8_t *pixels,uint width,uint height,
        RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  byte bVar1;
  iterator iVar2;
  pointer ppVar3;
  pointer ppVar4;
  uint uVar5;
  uint uVar6;
  undefined1 *__s;
  pointer ppRVar7;
  ulong uVar9;
  byte bVar10;
  uint edge;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
  local_18e8 [8];
  vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
  boundaryPixels [256];
  Region rootRegion;
  ulong local_70;
  undefined1 auStack_58 [8];
  vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> componentStack;
  pair<unsigned_int,_unsigned_char> local_38;
  ulong uVar8;
  ulong __n;
  
  if (height == 0 || width == 0) {
    rootRegion.next = (Region *)0x0;
  }
  else {
    uVar14 = height * width;
    __n = (ulong)uVar14;
    __s = (undefined1 *)operator_new__(__n);
    if (uVar14 != 0) {
      memset(__s,0,__n);
    }
    _auStack_58 = (undefined1  [16])0x0;
    componentStack.
    super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    componentStack.
    super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = height;
    std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::reserve
              ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
               auStack_58,0x100);
    memset(local_18e8,0,0x1800);
    uVar12 = (uint)*pixels;
    *__s = 1;
    local_38 = (pair<unsigned_int,_unsigned_char>)
               &boundaryPixels[0xff].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boundaryPixels[0xff].
    super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
      _M_realloc_insert<RegionDetector::Region*>
                ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)
                 auStack_58,
                 (iterator)
                 componentStack.
                 super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,(Region **)&local_38);
    }
    else {
      *componentStack.
       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Region *)local_38;
      componentStack.
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
    }
    uVar9 = 0;
LAB_00102761:
    local_38 = (pair<unsigned_int,_unsigned_char>)
               RegionAllocator<RegionDetector::Region>::new_(regionAllocator,uVar12);
    if (componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
      _M_realloc_insert<RegionDetector::Region*>
                ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)
                 auStack_58,
                 (iterator)
                 componentStack.
                 super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,(Region **)&local_38);
      ppRVar7 = componentStack.
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *componentStack.
       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Region *)local_38;
      ppRVar7 = componentStack.
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      componentStack.
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
      _M_impl.super__Vector_impl_data._M_start = ppRVar7;
    }
    if (ppRVar7[-1] == (Region *)0x0) {
      __assert_fail("componentStack.back() != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                    ,0x6d,
                    "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    bVar10 = 0;
    uVar13 = uVar12;
    local_70 = uVar9;
    do {
      uVar8 = (ulong)uVar13;
      uVar6 = (uint)local_70;
      if (bVar10 < 4) {
        edge = (uint)bVar10;
        uVar12 = componentStack.
                 super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        do {
          uVar5 = getNeighborIdx(this,uVar6,width,uVar12,edge);
          uVar9 = (ulong)uVar5;
          if (uVar14 <= uVar5) {
            __assert_fail("neighborIdx < width*height",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                          ,0x71,
                          "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                         );
          }
          if (__s[uVar9] == '\0') {
            __s[uVar9] = 1;
            uVar12 = (uint)pixels[uVar9];
            if (uVar12 < uVar13) {
              local_38.second = (char)edge + '\x01';
              local_38.first = uVar6;
              iVar2._M_current =
                   boundaryPixels[uVar8].
                   super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  boundaryPixels[uVar8].
                  super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                ::_M_realloc_insert<std::pair<unsigned_int,unsigned_char>>
                          ((vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                            *)&boundaryPixels[uVar8 - 1].
                               super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,&local_38);
              }
              else {
                *iVar2._M_current = local_38;
                boundaryPixels[uVar8].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     boundaryPixels[uVar8].
                     super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
              }
              goto LAB_00102761;
            }
            local_38.second = '\0';
            local_38.first = uVar5;
            iVar2._M_current =
                 boundaryPixels[uVar12].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                boundaryPixels[uVar12].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
              ::_M_realloc_insert<std::pair<unsigned_int,unsigned_char>>
                        ((vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                          *)&boundaryPixels[(ulong)uVar12 - 1].
                             super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,&local_38);
              uVar12 = componentStack.
                       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            }
            else {
              *iVar2._M_current = local_38;
              boundaryPixels[uVar12].
              super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   boundaryPixels[uVar12].
                   super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
              uVar12 = componentStack.
                       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            }
          }
          edge = edge + 1;
        } while (edge != 4);
        bVar10 = 4;
      }
      if (auStack_58 ==
          (undefined1  [8])
          componentStack.
          super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("!componentStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                      ,0x84,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      Region::accumulate(componentStack.
                         super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1],uVar6,(uint)pixels[local_70],
                         width);
      uVar12 = uVar13 + 1;
      if (uVar13 + 1 < 0x101) {
        uVar12 = 0x100;
      }
      do {
        ppVar3 = boundaryPixels[uVar8 - 1].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar4 = boundaryPixels[uVar8].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar3 != ppVar4) {
          local_70 = (ulong)ppVar4[-1].first;
          bVar10 = ppVar4[-1].second;
          boundaryPixels[uVar8].
          super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar4 + -1;
          bVar1 = pixels[local_70];
          if (uVar13 != bVar1) {
            if (bVar1 <= uVar13) {
              __assert_fail("currentLevel > previousLevel",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                            ,0x9f,
                            "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                           );
            }
            processStack(this,(uint)bVar1,
                         (vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)auStack_58,regionAllocator);
            uVar13 = (uint)bVar1;
          }
          goto LAB_0010294f;
        }
        uVar6 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar6;
      } while (uVar12 != uVar6);
      if ((long)componentStack.
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 != 0x10) {
        __assert_fail("componentStack.size() == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                      ,0x8d,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      if (__n != 0) {
        uVar9 = 0;
        do {
          if (__s[uVar9] == '\0') {
            __assert_fail("accessible[i] == true",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                          ,0xaa,
                          "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                         );
          }
          uVar9 = uVar9 + 1;
        } while (__n != uVar9);
      }
      operator_delete__(__s);
      rootRegion.next =
           componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_start[-1];
      uVar13 = uVar12;
LAB_0010294f:
    } while (ppVar3 != ppVar4);
    if (boundaryPixels[0xff].
        super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(boundaryPixels[0xff].
                      super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    lVar11 = 0x17e8;
    do {
      if (*(void **)(local_18e8 + lVar11) != (void *)0x0) {
        operator_delete(*(void **)(local_18e8 + lVar11));
      }
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58);
    }
  }
  return rootRegion.next;
}

Assistant:

REGION_TYPE* detect(uint8_t const * const pixels, const unsigned int width, const unsigned int height, REGION_ALLOCATOR_TYPE *regionAllocator) {

			// pixel index first, edge second
			typedef std::pair<unsigned int, unsigned char> PixelAndEdgeType;

			if (width == 0 || height == 0) {
				return nullptr;
			}

			const int N_NEIGHBORS = 4;

			// true if the pixel has already been accessed
			bool * const accessible = new bool[width*height];
			assert(accessible);
			for (unsigned int i = 0; i < width*height; i++) {
				accessible[i] = false;
			}

			std::vector<REGION_TYPE*> componentStack;
			componentStack.reserve(256);

			std::vector<PixelAndEdgeType> boundaryPixels[256];

			unsigned int currentIdx = 0;
			unsigned int currentLevel = pixels[currentIdx];

			accessible[currentIdx] = true;
			REGION_TYPE rootRegion(256);
			componentStack.push_back(&rootRegion);

			unsigned char currentEdge = 0;

		push_empty_component:
			componentStack.push_back(regionAllocator->new_(currentLevel));
			assert(componentStack.back() != nullptr);
		check_neighbors:
			for (; currentEdge < N_NEIGHBORS; currentEdge++) {
				const unsigned int neighborIdx = getNeighborIdx(currentIdx, width, height, currentEdge);
				assert(neighborIdx < width*height);
				if (!accessible[neighborIdx]) {
					accessible[neighborIdx] = true;
					unsigned int neighborLevel = pixels[neighborIdx];
					if (neighborLevel < currentLevel) {
						// neighbor is smaller, push this pixel back
						boundaryPixels[currentLevel].push_back(PixelAndEdgeType(currentIdx, currentEdge + 1));
						currentIdx = neighborIdx;
						currentLevel = neighborLevel;
						currentEdge = 0;
						goto push_empty_component;
					}
					else
					{
						boundaryPixels[neighborLevel].push_back(PixelAndEdgeType(neighborIdx, 0));
					}
				}
			}

			assert(!componentStack.empty());
			auto comp = componentStack.back();
			comp->accumulate(currentIdx, pixels[currentIdx], width);
			const unsigned int previousLevel = currentLevel;

			while (boundaryPixels[currentLevel].empty()) {
				currentLevel++;

				if (currentLevel > 255) {
					assert(componentStack.size() == 2);
					goto done;
				}
			}

			{
				PixelAndEdgeType pe = boundaryPixels[currentLevel].back();
				currentIdx = pe.first;
				currentEdge = pe.second;
			}
			boundaryPixels[currentLevel].pop_back();

			currentLevel = pixels[currentIdx];

			{
				unsigned int newPixelGrayLevel = pixels[currentIdx];

				if (currentLevel != previousLevel) {
					assert(currentLevel > previousLevel);
					currentLevel = newPixelGrayLevel;
					processStack(newPixelGrayLevel, componentStack, regionAllocator);
				}
			}
			goto check_neighbors;


		done:
			// all pixels must be accessible in the end
			for (unsigned int i = 0; i < width*height; i++) {
				assert(accessible[i] == true);
			}

			delete[] accessible;
			return componentStack.back();
		}